

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

QVariant * __thiscall
QGraphicsView::inputMethodQuery
          (QVariant *__return_storage_ptr__,QGraphicsView *this,InputMethodQuery query)

{
  QGraphicsViewPrivate *this_00;
  Data *pDVar1;
  QObject *pQVar2;
  QRectF QVar3;
  int iVar4;
  QPoint QVar5;
  undefined8 uVar6;
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  double in_XMM1_Qa;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  QRect QVar12;
  QRectF local_a8;
  QRectF local_88;
  QRectF local_68;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  pDVar1 = (this_00->scene).wp.d;
  if (((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
     ((this_00->scene).wp.value == (QObject *)0x0)) {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    goto LAB_00641ef8;
  }
  *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = (this_00->scene).wp.value;
  (**(code **)(*(long *)pQVar2 + 0x60))
            (__return_storage_ptr__,pQVar2,CONCAT44(in_register_00000014,query));
  iVar4 = ::QVariant::typeId(__return_storage_ptr__);
  if (iVar4 == 0x14) {
    ::QVariant::toRectF();
    QGraphicsViewPrivate::mapRectFromScene(&local_68,this_00,&local_88);
    QVar3.yp = local_68.yp;
    QVar3.xp = local_68.xp;
    QVar3.w = local_68.w;
    QVar3.h = local_68.h;
    ::QVariant::QVariant(&local_48,QVar3);
  }
  else {
    iVar4 = ::QVariant::typeId(__return_storage_ptr__);
    if (iVar4 == 0x1a) {
      local_88.xp = (qreal)::QVariant::toPointF();
      local_88.yp = in_XMM1_Qa;
    }
    else {
      iVar4 = ::QVariant::typeId(__return_storage_ptr__);
      if (iVar4 == 0x13) {
        auVar11 = ::QVariant::toRect();
        local_a8.xp = (qreal)auVar11._0_4_;
        local_a8.yp = (qreal)auVar11._4_4_;
        local_a8.w = (qreal)(((long)auVar11._8_4_ - (long)auVar11._0_4_) + 1);
        local_a8.h = (qreal)(((auVar11._8_8_ >> 0x20) - (auVar11._0_8_ >> 0x20)) + 1);
        QGraphicsViewPrivate::mapRectFromScene(&local_88,this_00,&local_a8);
        dVar7 = (double)((ulong)local_88.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_88.xp
        ;
        dVar9 = 2147483647.0;
        if (dVar7 <= 2147483647.0) {
          dVar9 = dVar7;
        }
        if (dVar9 <= -2147483648.0) {
          dVar9 = -2147483648.0;
        }
        QVar12.x1.m_i = (int)dVar9;
        dVar10 = (double)((ulong)local_88.yp & 0x8000000000000000 | 0x3fe0000000000000) +
                 local_88.yp;
        dVar7 = 2147483647.0;
        if (dVar10 <= 2147483647.0) {
          dVar7 = dVar10;
        }
        if (dVar7 <= -2147483648.0) {
          dVar7 = -2147483648.0;
        }
        dVar10 = (local_88.xp - (double)(int)dVar9) * 0.5 + local_88.w;
        dVar10 = (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
        dVar9 = 2147483647.0;
        if (dVar10 <= 2147483647.0) {
          dVar9 = dVar10;
        }
        if (dVar9 <= -2147483648.0) {
          dVar9 = -2147483648.0;
        }
        dVar8 = (local_88.yp - (double)(int)dVar7) * 0.5 + local_88.h;
        dVar8 = (double)((ulong)dVar8 & 0x8000000000000000 | 0x3fe0000000000000) + dVar8;
        dVar10 = 2147483647.0;
        if (dVar8 <= 2147483647.0) {
          dVar10 = dVar8;
        }
        if (dVar10 <= -2147483648.0) {
          dVar10 = -2147483648.0;
        }
        QVar12.x2.m_i = QVar12.x1.m_i + (int)dVar9 + -1;
        QVar12.y1.m_i = (int)dVar7;
        QVar12.y2.m_i = (int)dVar7 + (int)dVar10 + -1;
        ::QVariant::QVariant(&local_48,QVar12);
        goto LAB_00641ee5;
      }
      iVar4 = ::QVariant::typeId(__return_storage_ptr__);
      if (iVar4 != 0x19) goto LAB_00641ef8;
      uVar6 = ::QVariant::toPoint();
      local_88.xp = (qreal)(int)uVar6;
      local_88.yp = (qreal)(int)((ulong)uVar6 >> 0x20);
    }
    QVar5 = mapFromScene(this,(QPointF *)&local_88);
    ::QVariant::QVariant(&local_48,QVar5);
  }
LAB_00641ee5:
  ::QVariant::operator=(__return_storage_ptr__,&local_48);
  ::QVariant::~QVariant(&local_48);
LAB_00641ef8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGraphicsView::inputMethodQuery(Qt::InputMethodQuery query) const
{
    Q_D(const QGraphicsView);
    if (!d->scene)
        return QVariant();

    QVariant value = d->scene->inputMethodQuery(query);
    if (value.userType() == QMetaType::QRectF)
        value = d->mapRectFromScene(value.toRectF());
    else if (value.userType() == QMetaType::QPointF)
        value = mapFromScene(value.toPointF());
    else if (value.userType() == QMetaType::QRect)
        value = d->mapRectFromScene(value.toRect()).toRect();
    else if (value.userType() == QMetaType::QPoint)
        value = mapFromScene(value.toPoint());
    return value;
}